

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QRenderRule::drawBorderImage(QRenderRule *this,QPainter *p,QRect *rect)

{
  QStyleSheetBorderData *pQVar1;
  QStyleSheetBorderImageData *pQVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QTileRules local_70;
  QRect local_68;
  QMargins local_58;
  QMargins local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  setClip(this,p,rect);
  pQVar1 = (this->bd).d.ptr;
  pQVar2 = (pQVar1->bi).d.ptr;
  local_48.m_top.m_i = pQVar2->cuts[0];
  local_48.m_right.m_i = pQVar2->cuts[1];
  local_48.m_bottom.m_i = pQVar2->cuts[2];
  local_48.m_left.m_i = pQVar2->cuts[3];
  local_58.m_top.m_i = pQVar1->borders[0];
  local_58.m_right.m_i = pQVar1->borders[1];
  local_58.m_bottom.m_i = pQVar1->borders[2];
  local_58.m_left.m_i = pQVar1->borders[3];
  QPainter::renderHints();
  QPainter::setRenderHint((RenderHint)p,true);
  uVar3 = QPixmap::size();
  local_68.x2.m_i = (int)uVar3 + -1;
  local_68.x1.m_i = 0;
  local_68.y1.m_i = 0;
  local_68.y2.m_i = (int)((ulong)uVar3 >> 0x20) + -1;
  local_70.horizontal = drawBorderImage::tileMode2TileRule[pQVar2->horizStretch];
  local_70.vertical = drawBorderImage::tileMode2TileRule[pQVar2->vertStretch];
  qDrawBorderPixmap(p,rect,&local_58,&pQVar2->pixmap,&local_68,&local_48,&local_70,(DrawingHints)0x0
                   );
  QPainter::setRenderHint((RenderHint)p,true);
  unsetClip(this,p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawBorderImage(QPainter *p, const QRect& rect)
{
    setClip(p, rect);
    static const Qt::TileRule tileMode2TileRule[] = {
        Qt::StretchTile, Qt::RoundTile, Qt::StretchTile, Qt::RepeatTile, Qt::StretchTile };

    const QStyleSheetBorderImageData *borderImageData = border()->borderImage();
    const int *targetBorders = border()->borders;
    const int *sourceBorders = borderImageData->cuts;
    QMargins sourceMargins(sourceBorders[LeftEdge], sourceBorders[TopEdge],
                           sourceBorders[RightEdge], sourceBorders[BottomEdge]);
    QMargins targetMargins(targetBorders[LeftEdge], targetBorders[TopEdge],
                           targetBorders[RightEdge], targetBorders[BottomEdge]);

    bool wasSmoothPixmapTransform = p->renderHints() & QPainter::SmoothPixmapTransform;
    p->setRenderHint(QPainter::SmoothPixmapTransform);
    qDrawBorderPixmap(p, rect, targetMargins, borderImageData->pixmap,
                      QRect(QPoint(), borderImageData->pixmap.size()), sourceMargins,
                      QTileRules(tileMode2TileRule[borderImageData->horizStretch], tileMode2TileRule[borderImageData->vertStretch]));
    p->setRenderHint(QPainter::SmoothPixmapTransform, wasSmoothPixmapTransform);
    unsetClip(p);
}